

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

int __thiscall
shadow::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
copy(holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this,
    EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR_copy_0012ec58;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (this->value_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,pcVar1 + (this->value_)._M_string_length);
  return (int)puVar2;
}

Assistant:

virtual holder_base*
    copy() const override
    {
        return new holder<T>(value_);
    }